

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Value VVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  undefined8 local_20 [2];
  undefined8 local_10;
  
  VVar2 = Pop(this);
  local_10 = VVar2.field_0._8_8_;
  VVar2 = Pop(this);
  local_20[0] = VVar2.field_0._8_8_;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(ushort *)((long)&local_38 + lVar1 * 2) =
         (ushort)*(byte *)((long)&local_10 + lVar1) * (ushort)*(byte *)((long)local_20 + lVar1);
  }
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}